

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.cpp
# Opt level: O0

void __thiscall CClient::OnDemoPlayerMessage(CClient *this)

{
  int in_stack_0000001c;
  void *in_stack_00000020;
  CClient *in_stack_00000028;
  
  OnDemoPlayerMessage(in_stack_00000028,in_stack_00000020,in_stack_0000001c);
  return;
}

Assistant:

void CClient::OnDemoPlayerMessage(void *pData, int Size)
{
	CUnpacker Unpacker;
	Unpacker.Reset(pData, Size);

	// unpack msgid and system flag
	int Msg = Unpacker.GetInt();
	int Sys = Msg&1;
	Msg >>= 1;

	if(Unpacker.Error())
		return;

	if(!Sys)
		GameClient()->OnMessage(Msg, &Unpacker);
}